

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

idx_t __thiscall
duckdb::HashAggregateGlobalSourceState::MaxThreads(HashAggregateGlobalSourceState *this)

{
  PhysicalHashAggregate *pPVar1;
  pointer pGVar2;
  const_reference this_00;
  reference this_01;
  type sink_p;
  idx_t iVar3;
  size_t sidx;
  ulong __n;
  long lVar4;
  
  pPVar1 = this->op;
  if ((pPVar1->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pPVar1->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 1;
  }
  else {
    pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(pPVar1->super_PhysicalOperator).sink_state);
    lVar4 = 0;
    for (__n = 0; pPVar1 = this->op,
        __n < (ulong)(((long)(pPVar1->groupings).
                             super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                             .
                             super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pPVar1->groupings).
                            super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                            .
                            super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x70); __n = __n + 1) {
      this_00 = vector<duckdb::HashAggregateGroupingData,_true>::get<true>(&pPVar1->groupings,__n);
      this_01 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::get<true>
                          ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)(pGVar2 + 1),
                           __n);
      sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
               ::operator*(&this_01->table_state);
      iVar3 = RadixPartitionedHashTable::MaxThreads(&this_00->table_data,sink_p);
      lVar4 = lVar4 + iVar3;
    }
    iVar3 = lVar4 + (ulong)(lVar4 == 0);
  }
  return iVar3;
}

Assistant:

idx_t MaxThreads() override {
		// If there are no tables, we only need one thread.
		if (op.groupings.empty()) {
			return 1;
		}

		auto &ht_state = op.sink_state->Cast<HashAggregateGlobalSinkState>();
		idx_t threads = 0;
		for (size_t sidx = 0; sidx < op.groupings.size(); ++sidx) {
			auto &grouping = op.groupings[sidx];
			auto &grouping_gstate = ht_state.grouping_states[sidx];
			threads += grouping.table_data.MaxThreads(*grouping_gstate.table_state);
		}
		return MaxValue<idx_t>(1, threads);
	}